

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

int mbedtls_mpi_self_test(int verbose)

{
  int iVar1;
  undefined1 local_c0 [8];
  mbedtls_mpi V;
  mbedtls_mpi U;
  mbedtls_mpi Y;
  mbedtls_mpi X;
  mbedtls_mpi N;
  mbedtls_mpi E;
  mbedtls_mpi A;
  uint local_10;
  int i;
  int ret;
  int verbose_local;
  
  mbedtls_mpi_init((mbedtls_mpi *)&E.p);
  mbedtls_mpi_init((mbedtls_mpi *)&N.p);
  mbedtls_mpi_init((mbedtls_mpi *)&X.p);
  mbedtls_mpi_init((mbedtls_mpi *)&Y.p);
  mbedtls_mpi_init((mbedtls_mpi *)&U.p);
  mbedtls_mpi_init((mbedtls_mpi *)&V.p);
  mbedtls_mpi_init((mbedtls_mpi *)local_c0);
  local_10 = mbedtls_mpi_read_string
                       ((mbedtls_mpi *)&E.p,0x10,
                        "EFE021C2645FD1DC586E69184AF4A31ED5F53E93B5F123FA41680867BA110131944FE7952E2517337780CB0DB80E61AAE7C8DDC6C5C6AADEB34EB38A2F40D5E6"
                       );
  if ((((local_10 == 0) &&
       (local_10 = mbedtls_mpi_read_string
                             ((mbedtls_mpi *)&N.p,0x10,
                              "B2E7EFD37075B9F03FF989C7C5051C2034D2A323810251127E7BF8625A4F49A5F3E27F4DA8BD59C47D6DAABA4C8127BD5B5C25763222FEFCCFC38B832366C29E"
                             ), local_10 == 0)) &&
      (local_10 = mbedtls_mpi_read_string
                            ((mbedtls_mpi *)&X.p,0x10,
                             "0066A198186C18C10B2F5ED9B522752A9830B69916E535C8F047518A889A43A594B6BED27A168D31D4A52F88925AA8F5"
                            ), local_10 == 0)) &&
     ((local_10 = mbedtls_mpi_mul_mpi((mbedtls_mpi *)&Y.p,(mbedtls_mpi *)&E.p,(mbedtls_mpi *)&X.p),
      local_10 == 0 &&
      (local_10 = mbedtls_mpi_read_string
                            ((mbedtls_mpi *)&V.p,0x10,
                             "602AB7ECA597A3D6B56FF9829A5E8B859E857EA95A03512E2BAE7391688D264AA5663B0341DB9CCFD2C4C5F421FEC8148001B72E848A38CAE1C65F78E56ABDEFE12D3C039B8A02D6BE593F0BBBDA56F1ECF677152EF804370C1A305CAF3B5BF130879B56C61DE584A0F53A2447A51E"
                            ), local_10 == 0)))) {
    if (verbose != 0) {
      printf("  MPI test #1 (mul_mpi): ");
    }
    iVar1 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)&Y.p,(mbedtls_mpi *)&V.p);
    if (iVar1 == 0) {
      if (verbose != 0) {
        printf("passed\n");
      }
      local_10 = mbedtls_mpi_div_mpi((mbedtls_mpi *)&Y.p,(mbedtls_mpi *)&U.p,(mbedtls_mpi *)&E.p,
                                     (mbedtls_mpi *)&X.p);
      if (((local_10 == 0) &&
          (local_10 = mbedtls_mpi_read_string
                                ((mbedtls_mpi *)&V.p,0x10,"256567336059E52CAE22925474705F39A94"),
          local_10 == 0)) &&
         (local_10 = mbedtls_mpi_read_string
                               ((mbedtls_mpi *)local_c0,0x10,
                                "6613F26162223DF488E9CD48CC132C7A0AC93C701B001B092E4E5B9F73BCD27B9EE50D0657C77F374E903CDFA4C642"
                               ), local_10 == 0)) {
        if (verbose != 0) {
          printf("  MPI test #2 (div_mpi): ");
        }
        iVar1 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)&Y.p,(mbedtls_mpi *)&V.p);
        if ((iVar1 == 0) &&
           (iVar1 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)&U.p,(mbedtls_mpi *)local_c0), iVar1 == 0)) {
          if (verbose != 0) {
            printf("passed\n");
          }
          local_10 = mbedtls_mpi_exp_mod((mbedtls_mpi *)&Y.p,(mbedtls_mpi *)&E.p,(mbedtls_mpi *)&N.p
                                         ,(mbedtls_mpi *)&X.p,(mbedtls_mpi *)0x0);
          if ((local_10 == 0) &&
             (local_10 = mbedtls_mpi_read_string
                                   ((mbedtls_mpi *)&V.p,0x10,
                                    "36E139AEA55215609D2816998ED020BBBD96C37890F65171D948E9BC7CBAA4D9325D24D6A3C12710F10A09FA08AB87"
                                   ), local_10 == 0)) {
            if (verbose != 0) {
              printf("  MPI test #3 (exp_mod): ");
            }
            iVar1 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)&Y.p,(mbedtls_mpi *)&V.p);
            if (iVar1 == 0) {
              if (verbose != 0) {
                printf("passed\n");
              }
              local_10 = mbedtls_mpi_inv_mod((mbedtls_mpi *)&Y.p,(mbedtls_mpi *)&E.p,
                                             (mbedtls_mpi *)&X.p);
              if ((local_10 == 0) &&
                 (local_10 = mbedtls_mpi_read_string
                                       ((mbedtls_mpi *)&V.p,0x10,
                                        "003A0AAEDD7E784FC07D8F9EC6E3BFD5C3DBA76456363A10869622EAC2DD84ECC5B8A74DAC4D09E03B5E0BE779F2DF61"
                                       ), local_10 == 0)) {
                if (verbose != 0) {
                  printf("  MPI test #4 (inv_mod): ");
                }
                iVar1 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)&Y.p,(mbedtls_mpi *)&V.p);
                if (iVar1 == 0) {
                  if (verbose != 0) {
                    printf("passed\n");
                    printf("  MPI test #5 (simple gcd): ");
                  }
                  for (A.p._4_4_ = 0; (int)A.p._4_4_ < 3; A.p._4_4_ = A.p._4_4_ + 1) {
                    local_10 = mbedtls_mpi_lset((mbedtls_mpi *)&Y.p,
                                                (long)gcd_pairs[(int)A.p._4_4_][0]);
                    if (((local_10 != 0) ||
                        (local_10 = mbedtls_mpi_lset((mbedtls_mpi *)&U.p,
                                                     (long)gcd_pairs[(int)A.p._4_4_][1]),
                        local_10 != 0)) ||
                       (local_10 = mbedtls_mpi_gcd((mbedtls_mpi *)&E.p,(mbedtls_mpi *)&Y.p,
                                                   (mbedtls_mpi *)&U.p), local_10 != 0))
                    goto LAB_0012343a;
                    iVar1 = mbedtls_mpi_cmp_int((mbedtls_mpi *)&E.p,
                                                (long)gcd_pairs[(int)A.p._4_4_][2]);
                    if (iVar1 != 0) {
                      if (verbose != 0) {
                        printf("failed at %d\n",(ulong)A.p._4_4_);
                      }
                      local_10 = 1;
                      goto LAB_0012343a;
                    }
                  }
                  if (verbose != 0) {
                    printf("passed\n");
                  }
                }
                else {
                  if (verbose != 0) {
                    printf("failed\n");
                  }
                  local_10 = 1;
                }
              }
            }
            else {
              if (verbose != 0) {
                printf("failed\n");
              }
              local_10 = 1;
            }
          }
        }
        else {
          if (verbose != 0) {
            printf("failed\n");
          }
          local_10 = 1;
        }
      }
    }
    else {
      if (verbose != 0) {
        printf("failed\n");
      }
      local_10 = 1;
    }
  }
LAB_0012343a:
  if ((local_10 != 0) && (verbose != 0)) {
    printf("Unexpected error, return code = %08X\n",(ulong)local_10);
  }
  mbedtls_mpi_free((mbedtls_mpi *)&E.p);
  mbedtls_mpi_free((mbedtls_mpi *)&N.p);
  mbedtls_mpi_free((mbedtls_mpi *)&X.p);
  mbedtls_mpi_free((mbedtls_mpi *)&Y.p);
  mbedtls_mpi_free((mbedtls_mpi *)&U.p);
  mbedtls_mpi_free((mbedtls_mpi *)&V.p);
  mbedtls_mpi_free((mbedtls_mpi *)local_c0);
  if (verbose != 0) {
    printf(anon_var_dwarf_debf + 8);
  }
  return local_10;
}

Assistant:

int mbedtls_mpi_self_test( int verbose )
{
    int ret, i;
    mbedtls_mpi A, E, N, X, Y, U, V;

    mbedtls_mpi_init( &A ); mbedtls_mpi_init( &E ); mbedtls_mpi_init( &N ); mbedtls_mpi_init( &X );
    mbedtls_mpi_init( &Y ); mbedtls_mpi_init( &U ); mbedtls_mpi_init( &V );

    MBEDTLS_MPI_CHK( mbedtls_mpi_read_string( &A, 16,
        "EFE021C2645FD1DC586E69184AF4A31E" \
        "D5F53E93B5F123FA41680867BA110131" \
        "944FE7952E2517337780CB0DB80E61AA" \
        "E7C8DDC6C5C6AADEB34EB38A2F40D5E6" ) );

    MBEDTLS_MPI_CHK( mbedtls_mpi_read_string( &E, 16,
        "B2E7EFD37075B9F03FF989C7C5051C20" \
        "34D2A323810251127E7BF8625A4F49A5" \
        "F3E27F4DA8BD59C47D6DAABA4C8127BD" \
        "5B5C25763222FEFCCFC38B832366C29E" ) );

    MBEDTLS_MPI_CHK( mbedtls_mpi_read_string( &N, 16,
        "0066A198186C18C10B2F5ED9B522752A" \
        "9830B69916E535C8F047518A889A43A5" \
        "94B6BED27A168D31D4A52F88925AA8F5" ) );

    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &X, &A, &N ) );

    MBEDTLS_MPI_CHK( mbedtls_mpi_read_string( &U, 16,
        "602AB7ECA597A3D6B56FF9829A5E8B85" \
        "9E857EA95A03512E2BAE7391688D264A" \
        "A5663B0341DB9CCFD2C4C5F421FEC814" \
        "8001B72E848A38CAE1C65F78E56ABDEF" \
        "E12D3C039B8A02D6BE593F0BBBDA56F1" \
        "ECF677152EF804370C1A305CAF3B5BF1" \
        "30879B56C61DE584A0F53A2447A51E" ) );

    if( verbose != 0 )
        mbedtls_printf( "  MPI test #1 (mul_mpi): " );

    if( mbedtls_mpi_cmp_mpi( &X, &U ) != 0 )
    {
        if( verbose != 0 )
            mbedtls_printf( "failed\n" );

        ret = 1;
        goto cleanup;
    }

    if( verbose != 0 )
        mbedtls_printf( "passed\n" );

    MBEDTLS_MPI_CHK( mbedtls_mpi_div_mpi( &X, &Y, &A, &N ) );

    MBEDTLS_MPI_CHK( mbedtls_mpi_read_string( &U, 16,
        "256567336059E52CAE22925474705F39A94" ) );

    MBEDTLS_MPI_CHK( mbedtls_mpi_read_string( &V, 16,
        "6613F26162223DF488E9CD48CC132C7A" \
        "0AC93C701B001B092E4E5B9F73BCD27B" \
        "9EE50D0657C77F374E903CDFA4C642" ) );

    if( verbose != 0 )
        mbedtls_printf( "  MPI test #2 (div_mpi): " );

    if( mbedtls_mpi_cmp_mpi( &X, &U ) != 0 ||
        mbedtls_mpi_cmp_mpi( &Y, &V ) != 0 )
    {
        if( verbose != 0 )
            mbedtls_printf( "failed\n" );

        ret = 1;
        goto cleanup;
    }

    if( verbose != 0 )
        mbedtls_printf( "passed\n" );

    MBEDTLS_MPI_CHK( mbedtls_mpi_exp_mod( &X, &A, &E, &N, NULL ) );

    MBEDTLS_MPI_CHK( mbedtls_mpi_read_string( &U, 16,
        "36E139AEA55215609D2816998ED020BB" \
        "BD96C37890F65171D948E9BC7CBAA4D9" \
        "325D24D6A3C12710F10A09FA08AB87" ) );

    if( verbose != 0 )
        mbedtls_printf( "  MPI test #3 (exp_mod): " );

    if( mbedtls_mpi_cmp_mpi( &X, &U ) != 0 )
    {
        if( verbose != 0 )
            mbedtls_printf( "failed\n" );

        ret = 1;
        goto cleanup;
    }

    if( verbose != 0 )
        mbedtls_printf( "passed\n" );

    MBEDTLS_MPI_CHK( mbedtls_mpi_inv_mod( &X, &A, &N ) );

    MBEDTLS_MPI_CHK( mbedtls_mpi_read_string( &U, 16,
        "003A0AAEDD7E784FC07D8F9EC6E3BFD5" \
        "C3DBA76456363A10869622EAC2DD84EC" \
        "C5B8A74DAC4D09E03B5E0BE779F2DF61" ) );

    if( verbose != 0 )
        mbedtls_printf( "  MPI test #4 (inv_mod): " );

    if( mbedtls_mpi_cmp_mpi( &X, &U ) != 0 )
    {
        if( verbose != 0 )
            mbedtls_printf( "failed\n" );

        ret = 1;
        goto cleanup;
    }

    if( verbose != 0 )
        mbedtls_printf( "passed\n" );

    if( verbose != 0 )
        mbedtls_printf( "  MPI test #5 (simple gcd): " );

    for( i = 0; i < GCD_PAIR_COUNT; i++ )
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &X, gcd_pairs[i][0] ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &Y, gcd_pairs[i][1] ) );

        MBEDTLS_MPI_CHK( mbedtls_mpi_gcd( &A, &X, &Y ) );

        if( mbedtls_mpi_cmp_int( &A, gcd_pairs[i][2] ) != 0 )
        {
            if( verbose != 0 )
                mbedtls_printf( "failed at %d\n", i );

            ret = 1;
            goto cleanup;
        }
    }

    if( verbose != 0 )
        mbedtls_printf( "passed\n" );

cleanup:

    if( ret != 0 && verbose != 0 )
        mbedtls_printf( "Unexpected error, return code = %08X\n", ret );

    mbedtls_mpi_free( &A ); mbedtls_mpi_free( &E ); mbedtls_mpi_free( &N ); mbedtls_mpi_free( &X );
    mbedtls_mpi_free( &Y ); mbedtls_mpi_free( &U ); mbedtls_mpi_free( &V );

    if( verbose != 0 )
        mbedtls_printf( "\n" );

    return( ret );
}